

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O1

void __thiscall llvm::AppleAcceleratorTable::Header::dump(Header *this,ScopedPrinter *W)

{
  StringRef Label;
  StringRef Label_00;
  StringRef Label_01;
  StringRef Label_02;
  StringRef Label_03;
  StringRef Label_04;
  StringRef N;
  DelimitedScope<___,____> local_20;
  DictScope HeaderScope;
  
  N.Length = 6;
  N.Data = "Header";
  DelimitedScope<'{',_'}'>::DelimitedScope(&local_20,W,N);
  Label.Length = 5;
  Label.Data = "Magic";
  ScopedPrinter::printHex<unsigned_int>(W,Label,this->Magic);
  Label_00.Length = 7;
  Label_00.Data = "Version";
  ScopedPrinter::printHex<unsigned_short>(W,Label_00,this->Version);
  Label_01.Length = 0xd;
  Label_01.Data = "Hash function";
  ScopedPrinter::printHex<unsigned_short>(W,Label_01,this->HashFunction);
  Label_02.Length = 0xc;
  Label_02.Data = "Bucket count";
  ScopedPrinter::printNumber(W,Label_02,this->BucketCount);
  Label_03.Length = 0xc;
  Label_03.Data = "Hashes count";
  ScopedPrinter::printNumber(W,Label_03,this->HashCount);
  Label_04.Length = 0x11;
  Label_04.Data = "HeaderData length";
  ScopedPrinter::printNumber(W,Label_04,this->HeaderDataLength);
  DelimitedScope<'{',_'}'>::~DelimitedScope(&local_20);
  return;
}

Assistant:

void AppleAcceleratorTable::Header::dump(ScopedPrinter &W) const {
  DictScope HeaderScope(W, "Header");
  W.printHex("Magic", Magic);
  W.printHex("Version", Version);
  W.printHex("Hash function", HashFunction);
  W.printNumber("Bucket count", BucketCount);
  W.printNumber("Hashes count", HashCount);
  W.printNumber("HeaderData length", HeaderDataLength);
}